

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve_intersector_virtual_8i.cpp
# Opt level: O2

VirtualCurveIntersector * embree::avx512::VirtualCurveIntersector8i(void)

{
  int iVar1;
  
  if ((VirtualCurveIntersector8i()::function_local_static_prim == '\0') &&
     (iVar1 = __cxa_guard_acquire(&VirtualCurveIntersector8i()::function_local_static_prim),
     iVar1 != 0)) {
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0x19].intersect1 =
         SphereMiIntersector1<8,_true>::intersect;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0x19].occluded1 =
         SphereMiIntersector1<8,_true>::occluded;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0x19].intersect4 =
         SphereMiIntersectorK<8,_4,_true>::intersect;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0x19].occluded4 =
         SphereMiIntersectorK<8,_4,_true>::occluded;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0x19].intersect8 =
         SphereMiIntersectorK<8,_8,_true>::intersect;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0x19].occluded8 =
         SphereMiIntersectorK<8,_8,_true>::occluded;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0x19].intersect16 =
         SphereMiIntersectorK<8,_16,_true>::intersect;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0x19].occluded16 =
         SphereMiIntersectorK<8,_16,_true>::occluded;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0x1a].intersect1 =
         DiscMiIntersector1<8,_true>::intersect;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0x1a].occluded1 =
         DiscMiIntersector1<8,_true>::occluded;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0x1a].intersect4 =
         DiscMiIntersectorK<8,_4,_true>::intersect;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0x1a].occluded4 =
         DiscMiIntersectorK<8,_4,_true>::occluded;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0x1a].intersect8 =
         DiscMiIntersectorK<8,_8,_true>::intersect;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0x1a].occluded8 =
         DiscMiIntersectorK<8,_8,_true>::occluded;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0x1a].intersect16 =
         DiscMiIntersectorK<8,_16,_true>::intersect;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0x1a].occluded16 =
         DiscMiIntersectorK<8,_16,_true>::occluded;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0x1b].intersect1 =
         OrientedDiscMiIntersector1<8,_true>::intersect;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0x1b].occluded1 =
         OrientedDiscMiIntersector1<8,_true>::occluded;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0x1b].intersect4 =
         OrientedDiscMiIntersectorK<8,_4,_true>::intersect;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0x1b].occluded4 =
         OrientedDiscMiIntersectorK<8,_4,_true>::occluded;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0x1b].intersect8 =
         OrientedDiscMiIntersectorK<8,_8,_true>::intersect;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0x1b].occluded8 =
         OrientedDiscMiIntersectorK<8,_8,_true>::occluded;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0x1b].intersect16 =
         OrientedDiscMiIntersectorK<8,_16,_true>::intersect;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0x1b].occluded16 =
         OrientedDiscMiIntersectorK<8,_16,_true>::occluded;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[3].intersect1 =
         ConeCurveMiIntersector1<8,_true>::intersect;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[3].occluded1 =
         ConeCurveMiIntersector1<8,_true>::occluded;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[3].intersect4 =
         ConeCurveMiIntersectorK<8,_4,_true>::intersect;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[3].occluded4 =
         ConeCurveMiIntersectorK<8,_4,_true>::occluded;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[3].intersect8 =
         ConeCurveMiIntersectorK<8,_8,_true>::intersect;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[3].occluded8 =
         ConeCurveMiIntersectorK<8,_8,_true>::occluded;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[3].intersect16 =
         ConeCurveMiIntersectorK<8,_16,_true>::intersect;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[3].occluded16 =
         ConeCurveMiIntersectorK<8,_16,_true>::occluded;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[1].intersect1 =
         RoundLinearCurveMiIntersector1<8,_true>::intersect;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[1].occluded1 =
         RoundLinearCurveMiIntersector1<8,_true>::occluded;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[1].intersect4 =
         RoundLinearCurveMiIntersectorK<8,_4,_true>::intersect;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[1].occluded4 =
         RoundLinearCurveMiIntersectorK<8,_4,_true>::occluded;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[1].intersect8 =
         RoundLinearCurveMiIntersectorK<8,_8,_true>::intersect;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[1].occluded8 =
         RoundLinearCurveMiIntersectorK<8,_8,_true>::occluded;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[1].intersect16 =
         RoundLinearCurveMiIntersectorK<8,_16,_true>::intersect;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[1].occluded16 =
         RoundLinearCurveMiIntersectorK<8,_16,_true>::occluded;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0].intersect1 =
         FlatLinearCurveMiIntersector1<8,_true>::intersect;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0].occluded1 =
         FlatLinearCurveMiIntersector1<8,_true>::occluded;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0].intersect4 =
         FlatLinearCurveMiIntersectorK<8,_4,_true>::intersect;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0].occluded4 =
         FlatLinearCurveMiIntersectorK<8,_4,_true>::occluded;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0].intersect8 =
         FlatLinearCurveMiIntersectorK<8,_8,_true>::intersect;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0].occluded8 =
         FlatLinearCurveMiIntersectorK<8,_8,_true>::occluded;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0].intersect16 =
         FlatLinearCurveMiIntersectorK<8,_16,_true>::intersect;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0].occluded16 =
         FlatLinearCurveMiIntersectorK<8,_16,_true>::occluded;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[5].intersect1 =
         CurveNiIntersector1<8>::
         intersect_t<embree::avx512::SweepCurve1Intersector1<embree::BezierCurveT>,embree::avx512::Intersect1Epilog1<true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[5].occluded1 =
         CurveNiIntersector1<8>::
         occluded_t<embree::avx512::SweepCurve1Intersector1<embree::BezierCurveT>,embree::avx512::Occluded1Epilog1<true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[5].intersect4 =
         CurveNiIntersectorK<8,4>::
         intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx512::Intersect1KEpilog1<4,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[5].occluded4 =
         CurveNiIntersectorK<8,4>::
         occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx512::Occluded1KEpilog1<4,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[5].intersect8 =
         CurveNiIntersectorK<8,8>::
         intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::BezierCurveT,8>,embree::avx512::Intersect1KEpilog1<8,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[5].occluded8 =
         CurveNiIntersectorK<8,8>::
         occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::BezierCurveT,8>,embree::avx512::Occluded1KEpilog1<8,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[5].intersect16 =
         CurveNiIntersectorK<8,16>::
         intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::BezierCurveT,16>,embree::avx512::Intersect1KEpilog1<16,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[5].occluded16 =
         CurveNiIntersectorK<8,16>::
         occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::BezierCurveT,16>,embree::avx512::Occluded1KEpilog1<16,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[4].intersect1 =
         CurveNiIntersector1<8>::
         intersect_t<embree::avx512::RibbonCurve1Intersector1<embree::BezierCurveT,8>,embree::avx512::Intersect1EpilogMU<8,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[4].occluded1 =
         CurveNiIntersector1<8>::
         occluded_t<embree::avx512::RibbonCurve1Intersector1<embree::BezierCurveT,8>,embree::avx512::Occluded1EpilogMU<8,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[4].intersect4 =
         CurveNiIntersectorK<8,4>::
         intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::BezierCurveT,4,8>,embree::avx512::Intersect1KEpilogMU<8,4,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[4].occluded4 =
         CurveNiIntersectorK<8,4>::
         occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::BezierCurveT,4,8>,embree::avx512::Occluded1KEpilogMU<8,4,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[4].intersect8 =
         CurveNiIntersectorK<8,8>::
         intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::BezierCurveT,8,8>,embree::avx512::Intersect1KEpilogMU<8,8,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[4].occluded8 =
         CurveNiIntersectorK<8,8>::
         occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::BezierCurveT,8,8>,embree::avx512::Occluded1KEpilogMU<8,8,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[4].intersect16 =
         CurveNiIntersectorK<8,16>::
         intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::BezierCurveT,16,8>,embree::avx512::Intersect1KEpilogMU<8,16,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[4].occluded16 =
         CurveNiIntersectorK<8,16>::
         occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::BezierCurveT,16,8>,embree::avx512::Occluded1KEpilogMU<8,16,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[6].intersect1 =
         CurveNiIntersector1<8>::
         intersect_n<embree::avx512::OrientedCurve1Intersector1<embree::BezierCurveT,7,8>,embree::avx512::Intersect1Epilog1<true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[6].occluded1 =
         CurveNiIntersector1<8>::
         occluded_n<embree::avx512::OrientedCurve1Intersector1<embree::BezierCurveT,7,8>,embree::avx512::Occluded1Epilog1<true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[6].intersect4 =
         CurveNiIntersectorK<8,4>::
         intersect_n<embree::avx512::OrientedCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx512::Intersect1KEpilog1<4,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[6].occluded4 =
         CurveNiIntersectorK<8,4>::
         occluded_n<embree::avx512::OrientedCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx512::Occluded1KEpilog1<4,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[6].intersect8 =
         CurveNiIntersectorK<8,8>::
         intersect_n<embree::avx512::OrientedCurve1IntersectorK<embree::BezierCurveT,8>,embree::avx512::Intersect1KEpilog1<8,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[6].occluded8 =
         CurveNiIntersectorK<8,8>::
         occluded_n<embree::avx512::OrientedCurve1IntersectorK<embree::BezierCurveT,8>,embree::avx512::Occluded1KEpilog1<8,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[6].intersect16 =
         CurveNiIntersectorK<8,16>::
         intersect_n<embree::avx512::OrientedCurve1IntersectorK<embree::BezierCurveT,16>,embree::avx512::Intersect1KEpilog1<16,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[6].occluded16 =
         CurveNiIntersectorK<8,16>::
         occluded_n<embree::avx512::OrientedCurve1IntersectorK<embree::BezierCurveT,16>,embree::avx512::Occluded1KEpilog1<16,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[9].intersect1 =
         CurveNiIntersector1<8>::
         intersect_t<embree::avx512::SweepCurve1Intersector1<embree::BSplineCurveT>,embree::avx512::Intersect1Epilog1<true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[9].occluded1 =
         CurveNiIntersector1<8>::
         occluded_t<embree::avx512::SweepCurve1Intersector1<embree::BSplineCurveT>,embree::avx512::Occluded1Epilog1<true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[9].intersect4 =
         CurveNiIntersectorK<8,4>::
         intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx512::Intersect1KEpilog1<4,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[9].occluded4 =
         CurveNiIntersectorK<8,4>::
         occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx512::Occluded1KEpilog1<4,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[9].intersect8 =
         CurveNiIntersectorK<8,8>::
         intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx512::Intersect1KEpilog1<8,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[9].occluded8 =
         CurveNiIntersectorK<8,8>::
         occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx512::Occluded1KEpilog1<8,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[9].intersect16 =
         CurveNiIntersectorK<8,16>::
         intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::BSplineCurveT,16>,embree::avx512::Intersect1KEpilog1<16,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[9].occluded16 =
         CurveNiIntersectorK<8,16>::
         occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::BSplineCurveT,16>,embree::avx512::Occluded1KEpilog1<16,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[8].intersect1 =
         CurveNiIntersector1<8>::
         intersect_t<embree::avx512::RibbonCurve1Intersector1<embree::BSplineCurveT,8>,embree::avx512::Intersect1EpilogMU<8,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[8].occluded1 =
         CurveNiIntersector1<8>::
         occluded_t<embree::avx512::RibbonCurve1Intersector1<embree::BSplineCurveT,8>,embree::avx512::Occluded1EpilogMU<8,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[8].intersect4 =
         CurveNiIntersectorK<8,4>::
         intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::BSplineCurveT,4,8>,embree::avx512::Intersect1KEpilogMU<8,4,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[8].occluded4 =
         CurveNiIntersectorK<8,4>::
         occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::BSplineCurveT,4,8>,embree::avx512::Occluded1KEpilogMU<8,4,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[8].intersect8 =
         CurveNiIntersectorK<8,8>::
         intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::BSplineCurveT,8,8>,embree::avx512::Intersect1KEpilogMU<8,8,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[8].occluded8 =
         CurveNiIntersectorK<8,8>::
         occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::BSplineCurveT,8,8>,embree::avx512::Occluded1KEpilogMU<8,8,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[8].intersect16 =
         CurveNiIntersectorK<8,16>::
         intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::BSplineCurveT,16,8>,embree::avx512::Intersect1KEpilogMU<8,16,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[8].occluded16 =
         CurveNiIntersectorK<8,16>::
         occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::BSplineCurveT,16,8>,embree::avx512::Occluded1KEpilogMU<8,16,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[10].intersect1 =
         CurveNiIntersector1<8>::
         intersect_n<embree::avx512::OrientedCurve1Intersector1<embree::BSplineCurveT,7,8>,embree::avx512::Intersect1Epilog1<true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[10].occluded1 =
         CurveNiIntersector1<8>::
         occluded_n<embree::avx512::OrientedCurve1Intersector1<embree::BSplineCurveT,7,8>,embree::avx512::Occluded1Epilog1<true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[10].intersect4 =
         CurveNiIntersectorK<8,4>::
         intersect_n<embree::avx512::OrientedCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx512::Intersect1KEpilog1<4,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[10].occluded4 =
         CurveNiIntersectorK<8,4>::
         occluded_n<embree::avx512::OrientedCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx512::Occluded1KEpilog1<4,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[10].intersect8 =
         CurveNiIntersectorK<8,8>::
         intersect_n<embree::avx512::OrientedCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx512::Intersect1KEpilog1<8,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[10].occluded8 =
         CurveNiIntersectorK<8,8>::
         occluded_n<embree::avx512::OrientedCurve1IntersectorK<embree::BSplineCurveT,8>,embree::avx512::Occluded1KEpilog1<8,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[10].intersect16 =
         CurveNiIntersectorK<8,16>::
         intersect_n<embree::avx512::OrientedCurve1IntersectorK<embree::BSplineCurveT,16>,embree::avx512::Intersect1KEpilog1<16,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[10].occluded16 =
         CurveNiIntersectorK<8,16>::
         occluded_n<embree::avx512::OrientedCurve1IntersectorK<embree::BSplineCurveT,16>,embree::avx512::Occluded1KEpilog1<16,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0xd].intersect1 =
         CurveNiIntersector1<8>::
         intersect_h<embree::avx512::SweepCurve1Intersector1<embree::HermiteCurveT>,embree::avx512::Intersect1Epilog1<true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0xd].occluded1 =
         CurveNiIntersector1<8>::
         occluded_h<embree::avx512::SweepCurve1Intersector1<embree::HermiteCurveT>,embree::avx512::Occluded1Epilog1<true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0xd].intersect4 =
         CurveNiIntersectorK<8,4>::
         intersect_h<embree::avx512::SweepCurve1IntersectorK<embree::HermiteCurveT,4>,embree::avx512::Intersect1KEpilog1<4,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0xd].occluded4 =
         CurveNiIntersectorK<8,4>::
         occluded_h<embree::avx512::SweepCurve1IntersectorK<embree::HermiteCurveT,4>,embree::avx512::Occluded1KEpilog1<4,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0xd].intersect8 =
         CurveNiIntersectorK<8,8>::
         intersect_h<embree::avx512::SweepCurve1IntersectorK<embree::HermiteCurveT,8>,embree::avx512::Intersect1KEpilog1<8,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0xd].occluded8 =
         CurveNiIntersectorK<8,8>::
         occluded_h<embree::avx512::SweepCurve1IntersectorK<embree::HermiteCurveT,8>,embree::avx512::Occluded1KEpilog1<8,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0xd].intersect16 =
         CurveNiIntersectorK<8,16>::
         intersect_h<embree::avx512::SweepCurve1IntersectorK<embree::HermiteCurveT,16>,embree::avx512::Intersect1KEpilog1<16,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0xd].occluded16 =
         CurveNiIntersectorK<8,16>::
         occluded_h<embree::avx512::SweepCurve1IntersectorK<embree::HermiteCurveT,16>,embree::avx512::Occluded1KEpilog1<16,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0xc].intersect1 =
         CurveNiIntersector1<8>::
         intersect_h<embree::avx512::RibbonCurve1Intersector1<embree::HermiteCurveT,8>,embree::avx512::Intersect1EpilogMU<8,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0xc].occluded1 =
         CurveNiIntersector1<8>::
         occluded_h<embree::avx512::RibbonCurve1Intersector1<embree::HermiteCurveT,8>,embree::avx512::Occluded1EpilogMU<8,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0xc].intersect4 =
         CurveNiIntersectorK<8,4>::
         intersect_h<embree::avx512::RibbonCurve1IntersectorK<embree::HermiteCurveT,4,8>,embree::avx512::Intersect1KEpilogMU<8,4,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0xc].occluded4 =
         CurveNiIntersectorK<8,4>::
         occluded_h<embree::avx512::RibbonCurve1IntersectorK<embree::HermiteCurveT,4,8>,embree::avx512::Occluded1KEpilogMU<8,4,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0xc].intersect8 =
         CurveNiIntersectorK<8,8>::
         intersect_h<embree::avx512::RibbonCurve1IntersectorK<embree::HermiteCurveT,8,8>,embree::avx512::Intersect1KEpilogMU<8,8,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0xc].occluded8 =
         CurveNiIntersectorK<8,8>::
         occluded_h<embree::avx512::RibbonCurve1IntersectorK<embree::HermiteCurveT,8,8>,embree::avx512::Occluded1KEpilogMU<8,8,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0xc].intersect16 =
         CurveNiIntersectorK<8,16>::
         intersect_h<embree::avx512::RibbonCurve1IntersectorK<embree::HermiteCurveT,16,8>,embree::avx512::Intersect1KEpilogMU<8,16,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0xc].occluded16 =
         CurveNiIntersectorK<8,16>::
         occluded_h<embree::avx512::RibbonCurve1IntersectorK<embree::HermiteCurveT,16,8>,embree::avx512::Occluded1KEpilogMU<8,16,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0xe].intersect1 =
         CurveNiIntersector1<8>::
         intersect_hn<embree::avx512::OrientedCurve1Intersector1<embree::HermiteCurveT,7,8>,embree::avx512::Intersect1Epilog1<true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0xe].occluded1 =
         CurveNiIntersector1<8>::
         occluded_hn<embree::avx512::OrientedCurve1Intersector1<embree::HermiteCurveT,7,8>,embree::avx512::Occluded1Epilog1<true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0xe].intersect4 =
         CurveNiIntersectorK<8,4>::
         intersect_hn<embree::avx512::OrientedCurve1IntersectorK<embree::HermiteCurveT,4>,embree::avx512::Intersect1KEpilog1<4,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0xe].occluded4 =
         CurveNiIntersectorK<8,4>::
         occluded_hn<embree::avx512::OrientedCurve1IntersectorK<embree::HermiteCurveT,4>,embree::avx512::Occluded1KEpilog1<4,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0xe].intersect8 =
         CurveNiIntersectorK<8,8>::
         intersect_hn<embree::avx512::OrientedCurve1IntersectorK<embree::HermiteCurveT,8>,embree::avx512::Intersect1KEpilog1<8,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0xe].occluded8 =
         CurveNiIntersectorK<8,8>::
         occluded_hn<embree::avx512::OrientedCurve1IntersectorK<embree::HermiteCurveT,8>,embree::avx512::Occluded1KEpilog1<8,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0xe].intersect16 =
         CurveNiIntersectorK<8,16>::
         intersect_hn<embree::avx512::OrientedCurve1IntersectorK<embree::HermiteCurveT,16>,embree::avx512::Intersect1KEpilog1<16,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0xe].occluded16 =
         CurveNiIntersectorK<8,16>::
         occluded_hn<embree::avx512::OrientedCurve1IntersectorK<embree::HermiteCurveT,16>,embree::avx512::Occluded1KEpilog1<16,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0x11].intersect1 =
         CurveNiIntersector1<8>::
         intersect_t<embree::avx512::SweepCurve1Intersector1<embree::CatmullRomCurveT>,embree::avx512::Intersect1Epilog1<true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0x11].occluded1 =
         CurveNiIntersector1<8>::
         occluded_t<embree::avx512::SweepCurve1Intersector1<embree::CatmullRomCurveT>,embree::avx512::Occluded1Epilog1<true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0x11].intersect4 =
         CurveNiIntersectorK<8,4>::
         intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx512::Intersect1KEpilog1<4,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0x11].occluded4 =
         CurveNiIntersectorK<8,4>::
         occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx512::Occluded1KEpilog1<4,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0x11].intersect8 =
         CurveNiIntersectorK<8,8>::
         intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx512::Intersect1KEpilog1<8,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0x11].occluded8 =
         CurveNiIntersectorK<8,8>::
         occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx512::Occluded1KEpilog1<8,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0x11].intersect16 =
         CurveNiIntersectorK<8,16>::
         intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::CatmullRomCurveT,16>,embree::avx512::Intersect1KEpilog1<16,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0x11].occluded16 =
         CurveNiIntersectorK<8,16>::
         occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::CatmullRomCurveT,16>,embree::avx512::Occluded1KEpilog1<16,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0x10].intersect1 =
         CurveNiIntersector1<8>::
         intersect_t<embree::avx512::RibbonCurve1Intersector1<embree::CatmullRomCurveT,8>,embree::avx512::Intersect1EpilogMU<8,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0x10].occluded1 =
         CurveNiIntersector1<8>::
         occluded_t<embree::avx512::RibbonCurve1Intersector1<embree::CatmullRomCurveT,8>,embree::avx512::Occluded1EpilogMU<8,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0x10].intersect4 =
         CurveNiIntersectorK<8,4>::
         intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,4,8>,embree::avx512::Intersect1KEpilogMU<8,4,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0x10].occluded4 =
         CurveNiIntersectorK<8,4>::
         occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,4,8>,embree::avx512::Occluded1KEpilogMU<8,4,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0x10].intersect8 =
         CurveNiIntersectorK<8,8>::
         intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,8,8>,embree::avx512::Intersect1KEpilogMU<8,8,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0x10].occluded8 =
         CurveNiIntersectorK<8,8>::
         occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,8,8>,embree::avx512::Occluded1KEpilogMU<8,8,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0x10].intersect16 =
         CurveNiIntersectorK<8,16>::
         intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,16,8>,embree::avx512::Intersect1KEpilogMU<8,16,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0x10].occluded16 =
         CurveNiIntersectorK<8,16>::
         occluded_t<embree::avx512::RibbonCurve1IntersectorK<embree::CatmullRomCurveT,16,8>,embree::avx512::Occluded1KEpilogMU<8,16,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0x12].intersect1 =
         CurveNiIntersector1<8>::
         intersect_n<embree::avx512::OrientedCurve1Intersector1<embree::CatmullRomCurveT,7,8>,embree::avx512::Intersect1Epilog1<true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0x12].occluded1 =
         CurveNiIntersector1<8>::
         occluded_n<embree::avx512::OrientedCurve1Intersector1<embree::CatmullRomCurveT,7,8>,embree::avx512::Occluded1Epilog1<true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0x12].intersect4 =
         CurveNiIntersectorK<8,4>::
         intersect_n<embree::avx512::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx512::Intersect1KEpilog1<4,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0x12].occluded4 =
         CurveNiIntersectorK<8,4>::
         occluded_n<embree::avx512::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx512::Occluded1KEpilog1<4,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0x12].intersect8 =
         CurveNiIntersectorK<8,8>::
         intersect_n<embree::avx512::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx512::Intersect1KEpilog1<8,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0x12].occluded8 =
         CurveNiIntersectorK<8,8>::
         occluded_n<embree::avx512::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx512::Occluded1KEpilog1<8,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0x12].intersect16 =
         CurveNiIntersectorK<8,16>::
         intersect_n<embree::avx512::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,16>,embree::avx512::Intersect1KEpilog1<16,true>>
    ;
    VirtualCurveIntersector8i::function_local_static_prim.vtbl[0x12].occluded16 =
         CurveNiIntersectorK<8,16>::
         occluded_n<embree::avx512::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,16>,embree::avx512::Occluded1KEpilog1<16,true>>
    ;
    __cxa_guard_release(&VirtualCurveIntersector8i()::function_local_static_prim);
  }
  return &VirtualCurveIntersector8i::function_local_static_prim;
}

Assistant:

VirtualCurveIntersector* VirtualCurveIntersector8i()
    {
      static VirtualCurveIntersector function_local_static_prim = []()
      {
        VirtualCurveIntersector intersector;
        intersector.vtbl[Geometry::GTY_SPHERE_POINT] = SphereNiIntersectors<8>();
        intersector.vtbl[Geometry::GTY_DISC_POINT] = DiscNiIntersectors<8>();
        intersector.vtbl[Geometry::GTY_ORIENTED_DISC_POINT] = OrientedDiscNiIntersectors<8>();
        intersector.vtbl[Geometry::GTY_CONE_LINEAR_CURVE ] = LinearConeNiIntersectors<8>();
        intersector.vtbl[Geometry::GTY_ROUND_LINEAR_CURVE ] = LinearRoundConeNiIntersectors<8>();
        intersector.vtbl[Geometry::GTY_FLAT_LINEAR_CURVE ] = LinearRibbonNiIntersectors<8>();
        intersector.vtbl[Geometry::GTY_ROUND_BEZIER_CURVE] = CurveNiIntersectors <BezierCurveT,8>();
        intersector.vtbl[Geometry::GTY_FLAT_BEZIER_CURVE ] = RibbonNiIntersectors<BezierCurveT,8>();
        intersector.vtbl[Geometry::GTY_ORIENTED_BEZIER_CURVE] = OrientedCurveNiIntersectors<BezierCurveT,8>();
        intersector.vtbl[Geometry::GTY_ROUND_BSPLINE_CURVE] = CurveNiIntersectors <BSplineCurveT,8>();
        intersector.vtbl[Geometry::GTY_FLAT_BSPLINE_CURVE ] = RibbonNiIntersectors<BSplineCurveT,8>();
        intersector.vtbl[Geometry::GTY_ORIENTED_BSPLINE_CURVE] = OrientedCurveNiIntersectors<BSplineCurveT,8>();
        intersector.vtbl[Geometry::GTY_ROUND_HERMITE_CURVE] = HermiteCurveNiIntersectors <HermiteCurveT,8>();
        intersector.vtbl[Geometry::GTY_FLAT_HERMITE_CURVE ] = HermiteRibbonNiIntersectors<HermiteCurveT,8>();
        intersector.vtbl[Geometry::GTY_ORIENTED_HERMITE_CURVE] = HermiteOrientedCurveNiIntersectors<HermiteCurveT,8>();
        intersector.vtbl[Geometry::GTY_ROUND_CATMULL_ROM_CURVE] = CurveNiIntersectors <CatmullRomCurveT,8>();
        intersector.vtbl[Geometry::GTY_FLAT_CATMULL_ROM_CURVE ] = RibbonNiIntersectors<CatmullRomCurveT,8>();
        intersector.vtbl[Geometry::GTY_ORIENTED_CATMULL_ROM_CURVE] = OrientedCurveNiIntersectors<CatmullRomCurveT,8>();
        return intersector;
      }();
      return &function_local_static_prim;
    }